

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_generalized_cepstrum_to_mel_generalized_cepstrum.cc
# Opt level: O0

bool __thiscall
sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::Run
          (MelGeneralizedCepstrumToMelGeneralizedCepstrum *this,
          vector<double,_std::allocator<double>_> *input,
          vector<double,_std::allocator<double>_> *output,Buffer *buffer)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference ppMVar4;
  long in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  const_iterator itr;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff78;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff80;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff88;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff98;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffa0;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffa8;
  __normal_iterator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*const_*,_std::vector<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>_>
  local_50 [2];
  double *local_40;
  double *local_38;
  double *local_30;
  long local_28;
  vector<double,_std::allocator<double>_> *local_20;
  vector<double,_std::allocator<double>_> *local_18;
  bool local_1;
  
  if ((((((ulong)(((_Vector_base<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
                    *)&in_RDI[4].super__Vector_base<double,_std::allocator<double>_>)->_M_impl).
                 super__Vector_impl_data._M_start & 1) == 0) ||
       (local_28 = in_RCX, local_20 = in_RDX, local_18 = in_RSI,
       sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
       sVar3 != (long)(*(int *)&(((_Vector_base<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
                                   *)&in_RDI->super__Vector_base<double,_std::allocator<double>_>)->
                                _M_impl).super__Vector_impl_data._M_finish + 1))) ||
      (local_20 == (vector<double,_std::allocator<double>_> *)0x0)) || (local_28 == 0)) {
    local_1 = false;
  }
  else {
    bVar1 = std::
            vector<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
            ::empty((vector<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
                     *)in_RDI);
    if (bVar1) {
      sVar3 = std::vector<double,_std::allocator<double>_>::size(local_20);
      if (sVar3 != (long)(*(int *)((long)&(((_Vector_base<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
                                             *)&in_RDI[1].
                                                super__Vector_base<double,_std::allocator<double>_>)
                                          ->_M_impl).super__Vector_impl_data._M_finish + 4) + 1)) {
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffa0._M_current,
                   (size_type)in_stack_ffffffffffffff98._M_current);
      }
      local_30 = (double *)
                 std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff78);
      local_38 = (double *)
                 std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff78);
      local_40 = (double *)
                 std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff78);
      std::
      copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      local_1 = true;
    }
    else {
      local_50[0]._M_current =
           (ModuleInterface **)
           std::
           vector<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
           ::begin((vector<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
                    *)in_stack_ffffffffffffff78);
      while( true ) {
        std::
        vector<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
        ::end((vector<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
               *)in_stack_ffffffffffffff78);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*const_*,_std::vector<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>_>
                            *)in_stack_ffffffffffffff80,
                           (__normal_iterator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*const_*,_std::vector<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>_>
                            *)in_stack_ffffffffffffff78);
        if (!bVar1) break;
        std::
        vector<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
        ::begin((vector<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
                 *)in_stack_ffffffffffffff78);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*const_*,_std::vector<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>_>
                            *)in_stack_ffffffffffffff80,
                           (__normal_iterator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*const_*,_std::vector<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>_>
                            *)in_stack_ffffffffffffff78);
        if (bVar1) {
          std::vector<double,_std::allocator<double>_>::swap(in_RDI,in_stack_ffffffffffffff88);
        }
        ppMVar4 = __gnu_cxx::
                  __normal_iterator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*const_*,_std::vector<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>_>
                  ::operator*(local_50);
        in_stack_ffffffffffffff88 = (vector<double,_std::allocator<double>_> *)*ppMVar4;
        std::
        vector<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
        ::begin((vector<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
                 *)in_stack_ffffffffffffff78);
        bVar1 = __gnu_cxx::operator==
                          ((__normal_iterator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*const_*,_std::vector<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>_>
                            *)in_stack_ffffffffffffff80,
                           (__normal_iterator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*const_*,_std::vector<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>_>
                            *)in_stack_ffffffffffffff78);
        in_stack_ffffffffffffff80 = local_18;
        if (!bVar1) {
          in_stack_ffffffffffffff80 = (vector<double,_std::allocator<double>_> *)(local_28 + 0x28);
        }
        iVar2 = (*(_func_int *)
                  (in_stack_ffffffffffffff88->super__Vector_base<double,_std::allocator<double>_>).
                  _M_impl.super__Vector_impl_data._M_start[3])
                          (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,local_20,local_28 + 8
                          );
        if ((((byte)iVar2 ^ 0xff) & 1) != 0) {
          return false;
        }
        __gnu_cxx::
        __normal_iterator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*const_*,_std::vector<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>_>
        ::operator++(local_50);
      }
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool MelGeneralizedCepstrumToMelGeneralizedCepstrum::Run(
    const std::vector<double>& input, std::vector<double>* output,
    MelGeneralizedCepstrumToMelGeneralizedCepstrum::Buffer* buffer) const {
  if (!is_valid_ ||
      input.size() != static_cast<std::size_t>(num_input_order_ + 1) ||
      NULL == output || NULL == buffer) {
    return false;
  }

  if (modules_.empty()) {
    if (output->size() != static_cast<std::size_t>(num_output_order_ + 1)) {
      output->resize(num_output_order_ + 1);
    }
    std::copy(input.begin(), input.end(), output->begin());
    return true;
  }

  for (std::vector<MelGeneralizedCepstrumToMelGeneralizedCepstrum::
                       ModuleInterface*>::const_iterator itr(modules_.begin());
       itr != modules_.end(); ++itr) {
    if (itr != modules_.begin()) {
      output->swap(buffer->temporary_mel_generalized_cepstrum_);
    }
    if (!(*itr)->Run((itr == modules_.begin())
                         ? input
                         : buffer->temporary_mel_generalized_cepstrum_,
                     output, &(buffer->frequency_transform_buffer_))) {
      return false;
    }
  }

  return true;
}